

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_buffered_data.cpp
# Opt level: O0

void __thiscall duckdb::SimpleBufferedData::Append(SimpleBufferedData *this,DataChunk *to_append)

{
  pointer this_00;
  pointer this_01;
  mutex_type *__m;
  idx_t in_RDI;
  unique_lock<std::mutex> lock;
  idx_t allocation_size;
  templated_unique_single_t chunk;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
  *in_stack_ffffffffffffff70;
  DataChunk *other;
  DataChunk *in_stack_ffffffffffffffb8;
  mutex_type *__i;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffffc0;
  Allocator *in_stack_ffffffffffffffc8;
  DataChunk *in_stack_ffffffffffffffd0;
  
  other = (DataChunk *)&stack0xffffffffffffffe8;
  make_uniq<duckdb::DataChunk>();
  this_00 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                      (in_stack_ffffffffffffff70);
  Allocator::DefaultAllocator();
  DataChunk::GetTypes(in_stack_ffffffffffffffb8);
  DataChunk::Initialize
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (idx_t)in_stack_ffffffffffffffb8);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x196986c);
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
            (in_stack_ffffffffffffff70);
  DataChunk::Copy(this_00,other,in_RDI);
  this_01 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                      (in_stack_ffffffffffffff70);
  __m = (mutex_type *)DataChunk::GetAllocationSize(this_00);
  __i = __m;
  ::std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)this_01,__m);
  ::std::__atomic_base<unsigned_long>::operator+=
            ((__atomic_base<unsigned_long> *)(in_RDI + 0xf0),(__int_type)__i);
  ::std::
  queue<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::deque<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>_>
  ::push((queue<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::deque<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>_>
          *)this_01,(value_type *)__m);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)this_01);
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::~unique_ptr
            ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
             0x196992c);
  return;
}

Assistant:

void SimpleBufferedData::Append(const DataChunk &to_append) {
	auto chunk = make_uniq<DataChunk>();
	chunk->Initialize(Allocator::DefaultAllocator(), to_append.GetTypes());
	to_append.Copy(*chunk, 0);
	auto allocation_size = chunk->GetAllocationSize();

	unique_lock<mutex> lock(glock);
	buffered_count += allocation_size;
	buffered_chunks.push(std::move(chunk));
}